

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::swap(mipmapped_texture *this,mipmapped_texture *img)

{
  uint uVar1;
  pixel_format pVar2;
  format fVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  component_flags cVar5;
  component_flags cVar6;
  
  uVar1 = this->m_width;
  this->m_width = img->m_width;
  img->m_width = uVar1;
  cVar5 = img->m_comp_flags;
  uVar1 = this->m_height;
  cVar6 = this->m_comp_flags;
  this->m_height = img->m_height;
  this->m_comp_flags = cVar5;
  img->m_height = uVar1;
  img->m_comp_flags = cVar6;
  pVar2 = this->m_format;
  this->m_format = img->m_format;
  img->m_format = pVar2;
  pvVar4 = (this->m_faces).m_p;
  (this->m_faces).m_p = (img->m_faces).m_p;
  (img->m_faces).m_p = pvVar4;
  uVar1 = (this->m_faces).m_size;
  (this->m_faces).m_size = (img->m_faces).m_size;
  (img->m_faces).m_size = uVar1;
  uVar1 = (this->m_faces).m_capacity;
  (this->m_faces).m_capacity = (img->m_faces).m_capacity;
  (img->m_faces).m_capacity = uVar1;
  dynamic_string::swap(&this->m_last_error,&img->m_last_error);
  fVar3 = this->m_source_file_type;
  this->m_source_file_type = img->m_source_file_type;
  img->m_source_file_type = fVar3;
  return;
}

Assistant:

void mipmapped_texture::swap(mipmapped_texture& img) {
    std::swap(m_width, img.m_width);
    std::swap(m_height, img.m_height);
    std::swap(m_comp_flags, img.m_comp_flags);
    std::swap(m_format, img.m_format);
  m_faces.swap(img.m_faces);
  m_last_error.swap(img.m_last_error);
  std::swap(m_source_file_type, img.m_source_file_type);

  CRNLIB_ASSERT(check());
}